

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
          (QRotationGate1<std::complex<float>_> *this,int qubit,real_type theta,bool fixed)

{
  bool fixed_local;
  real_type theta_local;
  int qubit_local;
  QRotationGate1<std::complex<float>_> *this_local;
  
  QGate1<std::complex<float>_>::QGate1(&this->super_QGate1<std::complex<float>_>,qubit);
  QAdjustable::QAdjustable
            ((QAdjustable *)&(this->super_QGate1<std::complex<float>_>).field_0xc,fixed);
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0014fae0;
  QRotation<float>::QRotation(&this->rotation_,theta);
  return;
}

Assistant:

QRotationGate1( const int qubit , const real_type theta ,
                        const bool fixed = false )
        : QGate1< T >( qubit )
        , rotation_( theta )
        , QAdjustable( fixed )
        { }